

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.h
# Opt level: O3

cbtScalar __thiscall
cbtCollisionWorld::ClosestRayResultCallback::addSingleResult
          (ClosestRayResultCallback *this,LocalRayResult *rayResult,bool normalInWorldSpace)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  float fVar3;
  undefined8 uVar4;
  cbtCollisionObject *pcVar5;
  float fVar6;
  undefined3 in_register_00000011;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  (this->super_RayResultCallback).m_closestHitFraction = rayResult->m_hitFraction;
  pcVar5 = rayResult->m_collisionObject;
  (this->super_RayResultCallback).m_collisionObject = pcVar5;
  if (CONCAT31(in_register_00000011,normalInWorldSpace) == 0) {
    fVar3 = (rayResult->m_hitNormalLocal).m_floats[1];
    cVar1 = (rayResult->m_hitNormalLocal).m_floats[0];
    cVar2 = (rayResult->m_hitNormalLocal).m_floats[2];
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (pcVar5->m_worldTransform).m_basis.m_el[0].
                                                    m_floats[1])),ZEXT416((uint)cVar1),
                             ZEXT416((uint)(pcVar5->m_worldTransform).m_basis.m_el[0].m_floats[0]));
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (pcVar5->m_worldTransform).m_basis.m_el[1].
                                                    m_floats[1])),ZEXT416((uint)cVar1),
                             ZEXT416((uint)(pcVar5->m_worldTransform).m_basis.m_el[1].m_floats[0]));
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (pcVar5->m_worldTransform).m_basis.m_el[2].
                                                    m_floats[1])),ZEXT416((uint)cVar1),
                             ZEXT416((uint)(pcVar5->m_worldTransform).m_basis.m_el[2].m_floats[0]));
    auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)cVar2),
                             ZEXT416((uint)(pcVar5->m_worldTransform).m_basis.m_el[0].m_floats[2]));
    auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)cVar2),
                             ZEXT416((uint)(pcVar5->m_worldTransform).m_basis.m_el[1].m_floats[2]));
    auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)cVar2),
                             ZEXT416((uint)(pcVar5->m_worldTransform).m_basis.m_el[2].m_floats[2]));
    auVar7 = vinsertps_avx(auVar7,auVar8,0x10);
    auVar7 = vinsertps_avx(auVar7,auVar9,0x28);
    *(undefined1 (*) [16])(this->m_hitNormalWorld).m_floats = auVar7;
  }
  else {
    uVar4 = *(undefined8 *)((rayResult->m_hitNormalLocal).m_floats + 2);
    *(undefined8 *)(this->m_hitNormalWorld).m_floats =
         *(undefined8 *)(rayResult->m_hitNormalLocal).m_floats;
    *(undefined8 *)((this->m_hitNormalWorld).m_floats + 2) = uVar4;
  }
  fVar3 = rayResult->m_hitFraction;
  uVar4 = *(undefined8 *)(this->m_rayToWorld).m_floats;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)&(this->super_RayResultCallback).field_0x24;
  fVar6 = 1.0 - fVar3;
  auVar8._0_4_ = fVar3 * (float)uVar4;
  auVar8._4_4_ = fVar3 * (float)((ulong)uVar4 >> 0x20);
  auVar8._8_4_ = fVar3 * 0.0;
  auVar8._12_4_ = fVar3 * 0.0;
  auVar9._4_4_ = fVar6;
  auVar9._0_4_ = fVar6;
  auVar9._8_4_ = fVar6;
  auVar9._12_4_ = fVar6;
  auVar7 = vfmadd213ps_fma(auVar9,auVar7,auVar8);
  uVar4 = vmovlps_avx(auVar7);
  *(undefined8 *)(this->m_hitPointWorld).m_floats = uVar4;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (this->m_rayToWorld).m_floats[2])),
                           ZEXT416((uint)fVar6),ZEXT416(*(uint *)&this->field_0x2c));
  (this->m_hitPointWorld).m_floats[2] = auVar7._0_4_;
  return rayResult->m_hitFraction;
}

Assistant:

virtual cbtScalar addSingleResult(LocalRayResult& rayResult, bool normalInWorldSpace)
		{
			//caller already does the filter on the m_closestHitFraction
			cbtAssert(rayResult.m_hitFraction <= m_closestHitFraction);

			m_closestHitFraction = rayResult.m_hitFraction;
			m_collisionObject = rayResult.m_collisionObject;
			if (normalInWorldSpace)
			{
				m_hitNormalWorld = rayResult.m_hitNormalLocal;
			}
			else
			{
				///need to transform normal into worldspace
				m_hitNormalWorld = m_collisionObject->getWorldTransform().getBasis() * rayResult.m_hitNormalLocal;
			}
			m_hitPointWorld.setInterpolate3(m_rayFromWorld, m_rayToWorld, rayResult.m_hitFraction);
			return rayResult.m_hitFraction;
		}